

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVoronoiSimplexSolver.cpp
# Opt level: O2

int __thiscall
cbtVoronoiSimplexSolver::getSimplex
          (cbtVoronoiSimplexSolver *this,cbtVector3 *pBuf,cbtVector3 *qBuf,cbtVector3 *yBuf)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < this->m_numVertices; lVar5 = lVar5 + 1) {
    puVar2 = (undefined8 *)((long)this->m_simplexVectorW[0].m_floats + lVar4);
    uVar3 = puVar2[1];
    puVar1 = (undefined8 *)((long)yBuf->m_floats + lVar4);
    *puVar1 = *puVar2;
    puVar1[1] = uVar3;
    puVar2 = (undefined8 *)((long)this->m_simplexPointsP[0].m_floats + lVar4);
    uVar3 = puVar2[1];
    puVar1 = (undefined8 *)((long)pBuf->m_floats + lVar4);
    *puVar1 = *puVar2;
    puVar1[1] = uVar3;
    puVar2 = (undefined8 *)((long)this->m_simplexPointsQ[0].m_floats + lVar4);
    uVar3 = puVar2[1];
    puVar1 = (undefined8 *)((long)qBuf->m_floats + lVar4);
    *puVar1 = *puVar2;
    puVar1[1] = uVar3;
    lVar4 = lVar4 + 0x10;
  }
  return this->m_numVertices;
}

Assistant:

int cbtVoronoiSimplexSolver::getSimplex(cbtVector3* pBuf, cbtVector3* qBuf, cbtVector3* yBuf) const
{
	int i;
	for (i = 0; i < numVertices(); i++)
	{
		yBuf[i] = m_simplexVectorW[i];
		pBuf[i] = m_simplexPointsP[i];
		qBuf[i] = m_simplexPointsQ[i];
	}
	return numVertices();
}